

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

int CompareMat(Mat *a,Mat *b,float epsilon)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  size_t sVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char *__format;
  ulong uVar9;
  uint uVar10;
  void *pvVar11;
  ulong uVar12;
  void *pvVar13;
  bool bVar14;
  float fVar15;
  Mat a1;
  Mat local_b8;
  Option local_70;
  long local_48;
  long local_40;
  Mat *local_38;
  
  if (a->elempack != 1) {
    local_b8.elemsize._0_4_ = 0;
    local_b8._20_8_ = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.c = 0;
    local_b8.cstep = 0;
    ncnn::Option::Option(&local_70);
    ncnn::convert_packing(a,&local_b8,1,&local_70);
    iVar6 = CompareMat(&local_b8,b,epsilon);
    piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar6;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar6;
    }
    if (local_b8.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_b8.allocator + 0x18))();
      return iVar6;
    }
LAB_00114c31:
    if (local_b8.data != (void *)0x0) {
      free(local_b8.data);
    }
    return iVar6;
  }
  if (b->elempack != 1) {
    local_b8.elemsize._0_4_ = 0;
    local_b8._20_8_ = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.c = 0;
    local_b8.cstep = 0;
    ncnn::Option::Option(&local_70);
    ncnn::convert_packing(b,&local_b8,1,&local_70);
    iVar6 = CompareMat(a,&local_b8,epsilon);
    piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar6;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar6;
    }
    if (local_b8.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_b8.allocator + 0x18))();
      return iVar6;
    }
    goto LAB_00114c31;
  }
  uVar12 = a->elemsize;
  if (uVar12 == 1) {
    local_b8.elemsize._0_4_ = 0;
    local_b8._20_8_ = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.c = 0;
    local_b8.cstep = 0;
    ncnn::Option::Option(&local_70);
    ncnn::cast_int8_to_float32(a,&local_b8,&local_70);
    iVar6 = CompareMat(&local_b8,b,epsilon);
    piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar6;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar6;
    }
    if (local_b8.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_b8.allocator + 0x18))();
      return iVar6;
    }
    goto LAB_00114c31;
  }
  if (uVar12 == 2) {
    local_b8.elemsize._0_4_ = 0;
    local_b8._20_8_ = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.c = 0;
    local_b8.cstep = 0;
    ncnn::Option::Option(&local_70);
    ncnn::cast_float16_to_float32(a,&local_b8,&local_70);
    iVar6 = CompareMat(&local_b8,b,epsilon);
    piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar6;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar6;
    }
    if (local_b8.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_b8.allocator + 0x18))();
      return iVar6;
    }
    goto LAB_00114c31;
  }
  uVar8 = b->elemsize;
  if (uVar8 == 1) {
    local_b8.elemsize._0_4_ = 0;
    local_b8._20_8_ = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.c = 0;
    local_b8.cstep = 0;
    ncnn::Option::Option(&local_70);
    ncnn::cast_int8_to_float32(b,&local_b8,&local_70);
    iVar6 = CompareMat(a,&local_b8,epsilon);
    piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar6;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar6;
    }
    if (local_b8.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_b8.allocator + 0x18))();
      return iVar6;
    }
    goto LAB_00114c31;
  }
  if (uVar8 == 2) {
    local_b8.elemsize._0_4_ = 0;
    local_b8._20_8_ = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.c = 0;
    local_b8.cstep = 0;
    ncnn::Option::Option(&local_70);
    ncnn::cast_float16_to_float32(b,&local_b8,&local_70);
    iVar6 = CompareMat(a,&local_b8,epsilon);
    piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar6;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar6;
    }
    if (local_b8.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_b8.allocator + 0x18))();
      return iVar6;
    }
    goto LAB_00114c31;
  }
  uVar9 = (ulong)(uint)a->dims;
  uVar10 = b->dims;
  if (a->dims == uVar10) {
    uVar9 = (ulong)(uint)a->w;
    uVar10 = b->w;
    if (a->w == uVar10) {
      uVar9 = (ulong)(uint)a->h;
      uVar10 = b->h;
      if (a->h == uVar10) {
        uVar3 = a->c;
        uVar9 = (ulong)uVar3;
        uVar10 = b->c;
        if (uVar3 == uVar10) {
          if (uVar12 == uVar8) {
            uVar10 = (uint)(0 < (int)uVar3);
            if (0 < (int)uVar3) {
              uVar10 = 1;
              local_40 = 0;
              local_38 = b;
              do {
                if (0 < a->h) {
                  local_48 = (long)local_38->w * local_38->elemsize;
                  sVar4 = a->elemsize;
                  pvVar11 = (void *)(local_38->elemsize * local_38->cstep * local_40 +
                                    (long)local_38->data);
                  iVar6 = a->w;
                  pvVar13 = (void *)(a->cstep * sVar4 * local_40 + (long)a->data);
                  uVar12 = 0;
                  do {
                    uVar8 = (ulong)a->w;
                    iVar7 = 0;
                    bVar14 = 0 < (long)uVar8;
                    if (0 < (long)uVar8) {
                      bVar14 = true;
                      uVar9 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar13 + uVar9 * 4);
                        fVar2 = *(float *)((long)pvVar11 + uVar9 * 4);
                        if (((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) &&
                           (epsilon < ABS(fVar1 - fVar2))) {
                          fVar15 = ABS(fVar2);
                          if (ABS(fVar2) <= ABS(fVar1)) {
                            fVar15 = ABS(fVar1);
                          }
                          if (fVar15 * epsilon <= ABS(fVar1 - fVar2)) {
                            fprintf(_stderr,
                                    "value not match  at c:%d h:%d w:%d    expect %f but got %f\n",
                                    SUB84((double)fVar1,0),(double)fVar2,local_40,
                                    uVar12 & 0xffffffff);
                            iVar7 = 1;
                            break;
                          }
                        }
                        uVar9 = uVar9 + 1;
                        bVar14 = uVar9 < uVar8;
                      } while (uVar9 != uVar8);
                    }
                    if (bVar14) goto LAB_00114ddc;
                    uVar12 = uVar12 + 1;
                    pvVar11 = (void *)((long)pvVar11 + local_48);
                    pvVar13 = (void *)((long)pvVar13 + (long)iVar6 * sVar4);
                  } while ((long)uVar12 < (long)a->h);
                }
                iVar7 = 5;
LAB_00114ddc:
                if ((iVar7 != 5) && (iVar7 != 0)) break;
                local_40 = local_40 + 1;
                uVar10 = (uint)(local_40 < a->c);
              } while (local_40 < a->c);
            }
            return -uVar10;
          }
          __format = "elemsize not match    expect %d but got %d\n";
          uVar9 = uVar12 & 0xffffffff;
          uVar8 = uVar8 & 0xffffffff;
          goto LAB_00114e5c;
        }
        __format = "c not match    expect %d but got %d\n";
      }
      else {
        __format = "h not match    expect %d but got %d\n";
      }
    }
    else {
      __format = "w not match    expect %d but got %d\n";
    }
  }
  else {
    __format = "dims not match    expect %d but got %d\n";
  }
  uVar8 = (ulong)uVar10;
LAB_00114e5c:
  fprintf(_stderr,__format,uVar9,uVar8);
  return -1;
}

Assistant:

static int CompareMat(const ncnn::Mat& a, const ncnn::Mat& b, float epsilon = 0.001)
{
    if (a.elempack != 1)
    {
        ncnn::Mat a1;
        ncnn::convert_packing(a, a1, 1);
        return CompareMat(a1, b, epsilon);
    }

    if (b.elempack != 1)
    {
        ncnn::Mat b1;
        ncnn::convert_packing(b, b1, 1);
        return CompareMat(a, b1, epsilon);
    }

    if (a.elemsize == 2u)
    {
        ncnn::Mat a32;
        cast_float16_to_float32(a, a32);
        return CompareMat(a32, b, epsilon);
    }
    if (a.elemsize == 1u)
    {
        ncnn::Mat a32;
        cast_int8_to_float32(a, a32);
        return CompareMat(a32, b, epsilon);
    }

    if (b.elemsize == 2u)
    {
        ncnn::Mat b32;
        cast_float16_to_float32(b, b32);
        return CompareMat(a, b32, epsilon);
    }
    if (b.elemsize == 1u)
    {
        ncnn::Mat b32;
        cast_int8_to_float32(b, b32);
        return CompareMat(a, b32, epsilon);
    }

    return Compare(a, b, epsilon);
}